

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_TestShell::
~TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_TestShell
          (TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_TestShell *this)

{
  TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_TestShell *this_local;
  
  ~TEST_MockCallTest_expectNoCallInScopeButActualCallInAnotherScope_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockCallTest, expectNoCallInScopeButActualCallInAnotherScope)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "scope2::lazy", expectations);

    mock("scope1").expectNoCall("lazy");
    mock("scope2").actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}